

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAT12.cpp
# Opt level: O0

void __thiscall Storage::Disk::FAT12::FAT12(FAT12 *this,string *file_name)

{
  long lVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  stat *psVar4;
  undefined4 *puVar5;
  bool bVar6;
  byte local_2f;
  uint8_t log_sector_size;
  uint16_t total_sectors;
  __off_t file_size;
  string *file_name_local;
  FAT12 *this_local;
  
  MFMSectorDump::MFMSectorDump(&this->super_MFMSectorDump,file_name);
  (this->super_MFMSectorDump).super_DiskImage._vptr_DiskImage = (_func_int **)&PTR__FAT12_00caa220;
  psVar4 = FileHolder::stats(&(this->super_MFMSectorDump).file_);
  lVar1 = psVar4->st_size;
  if (lVar1 < 0x200) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0xfffffffe;
    __cxa_throw(puVar5,&Error::typeinfo,0);
  }
  FileHolder::seek(&(this->super_MFMSectorDump).file_,0xb,0);
  uVar2 = FileHolder::get16le(&(this->super_MFMSectorDump).file_);
  this->sector_size_ = (uint)uVar2;
  FileHolder::seek(&(this->super_MFMSectorDump).file_,0x13,0);
  uVar2 = FileHolder::get16le(&(this->super_MFMSectorDump).file_);
  FileHolder::seek(&(this->super_MFMSectorDump).file_,0x18,0);
  uVar3 = FileHolder::get16le(&(this->super_MFMSectorDump).file_);
  this->sector_count_ = (uint)uVar3;
  uVar3 = FileHolder::get16le(&(this->super_MFMSectorDump).file_);
  this->head_count_ = (uint)uVar3;
  if (lVar1 != (int)((uint)uVar2 * this->sector_size_)) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0xfffffffe;
    __cxa_throw(puVar5,&Error::typeinfo,0);
  }
  if ((int)((long)(ulong)uVar2 % (long)(this->head_count_ * this->sector_count_)) != 0) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0xfffffffe;
    __cxa_throw(puVar5,&Error::typeinfo,0);
  }
  this->track_count_ = (int)((long)(ulong)uVar2 / (long)(this->head_count_ * this->sector_count_));
  local_2f = 2;
  while( true ) {
    bVar6 = false;
    if (local_2f < 5) {
      bVar6 = 1 << (local_2f + 7 & 0x1f) != this->sector_size_;
    }
    if (!bVar6) break;
    local_2f = local_2f + 1;
  }
  if (4 < local_2f) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0xfffffffe;
    __cxa_throw(puVar5,&Error::typeinfo,0);
  }
  MFMSectorDump::set_geometry
            (&this->super_MFMSectorDump,this->sector_count_,local_2f,'\x01',
             (10 < this->sector_count_) + Double);
  return;
}

Assistant:

FAT12::FAT12(const std::string &file_name) :
	MFMSectorDump(file_name) {
	// The only sanity check here is whether a sensible
	// geometry is encoded in the first sector, or can be guessed.
	const auto file_size = file_.stats().st_size;

	if(file_size < 512) throw Error::InvalidFormat;

	// Inspect the FAT.
	file_.seek(11, SEEK_SET);
	sector_size_ = file_.get16le();
	file_.seek(19, SEEK_SET);
	const uint16_t total_sectors = file_.get16le();
	file_.seek(24, SEEK_SET);
	sector_count_ = file_.get16le();
	head_count_ = file_.get16le();

	// Throw if there would seemingly be an incomplete track.
	if(file_size != total_sectors*sector_size_) throw Error::InvalidFormat;
	if(total_sectors % (head_count_ * sector_count_)) throw Error::InvalidFormat;
	track_count_ = int(total_sectors / (head_count_ * sector_count_));

	// Check that there is a valid power-of-two sector size.
	uint8_t log_sector_size = 2;
	while(log_sector_size < 5 && (1 << (7+log_sector_size)) != sector_size_) {
		++log_sector_size;
	}
	if(log_sector_size >= 5) throw Error::InvalidFormat;

	set_geometry(
		sector_count_,
		log_sector_size,
		1,
		sector_count_ > 10 ? Encodings::MFM::Density::High : Encodings::MFM::Density::Double
	);
}